

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

int big2_scanComment(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte *pbVar1;
  byte bVar2;
  char cVar3;
  byte *pbVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  
  iVar7 = -1;
  if (1 < (long)end - (long)ptr) {
    iVar6 = 0;
    iVar7 = 0;
    if ((*ptr == '\0') && (iVar7 = iVar6, ptr[1] == '-')) {
      pbVar1 = (byte *)(ptr + 2);
joined_r0x006d8ecd:
      pbVar4 = pbVar1;
      uVar5 = (long)end - (long)pbVar4;
      if ((long)uVar5 < 2) {
        return -1;
      }
      bVar2 = *pbVar4;
      ptr = (char *)pbVar4;
      if (0xdb < bVar2) {
        if (bVar2 != 0xff) {
          if (3 < bVar2 - 0xdc) goto switchD_006d8f37_caseD_2;
          goto switchD_006d8f37_caseD_0;
        }
        if (0xfd < pbVar4[1]) goto switchD_006d8f37_caseD_0;
switchD_006d8f37_caseD_2:
        pbVar1 = pbVar4 + 2;
        goto joined_r0x006d8ecd;
      }
      if (bVar2 - 0xd8 < 4) {
switchD_006d8f37_caseD_7:
        if (uVar5 < 4) {
          return -2;
        }
        pbVar1 = pbVar4 + 4;
        goto joined_r0x006d8ecd;
      }
      if (bVar2 != 0) goto switchD_006d8f37_caseD_2;
      cVar3 = *(char *)((long)enc[1].scanners + (ulong)pbVar4[1]);
      switch(cVar3) {
      case '\0':
      case '\x01':
      case '\b':
        goto switchD_006d8f37_caseD_0;
      case '\x02':
      case '\x03':
      case '\x04':
      case '\x05':
        goto switchD_006d8f37_caseD_2;
      case '\x06':
        if (uVar5 == 2) {
          return -2;
        }
        pbVar1 = pbVar4 + 3;
        goto joined_r0x006d8ecd;
      case '\a':
        goto switchD_006d8f37_caseD_7;
      }
      if (cVar3 != '\x1b') goto switchD_006d8f37_caseD_2;
      pbVar1 = pbVar4 + 2;
      if ((long)end - (long)pbVar1 < 2) {
        return -1;
      }
      if ((*pbVar1 != 0) || (pbVar4[3] != 0x2d)) goto joined_r0x006d8ecd;
      ptr = (char *)(pbVar4 + 4);
      if ((long)end - (long)ptr < 2) {
        return -1;
      }
      iVar7 = 0;
      if (*ptr == 0) {
        if (pbVar4[5] == 0x3e) {
          ptr = (char *)(pbVar4 + 6);
        }
        iVar7 = 0xd;
        if (pbVar4[5] != 0x3e) {
          iVar7 = 0;
        }
      }
    }
switchD_006d8f37_caseD_0:
    *nextTokPtr = ptr;
  }
  return iVar7;
}

Assistant:

static int PTRCALL
PREFIX(scanComment)(const ENCODING *enc, const char *ptr, const char *end,
                    const char **nextTokPtr) {
  if (HAS_CHAR(enc, ptr, end)) {
    if (! CHAR_MATCHES(enc, ptr, ASCII_MINUS)) {
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
    ptr += MINBPC(enc);
    while (HAS_CHAR(enc, ptr, end)) {
      switch (BYTE_TYPE(enc, ptr)) {
        INVALID_CASES(ptr, nextTokPtr)
      case BT_MINUS:
        ptr += MINBPC(enc);
        REQUIRE_CHAR(enc, ptr, end);
        if (CHAR_MATCHES(enc, ptr, ASCII_MINUS)) {
          ptr += MINBPC(enc);
          REQUIRE_CHAR(enc, ptr, end);
          if (! CHAR_MATCHES(enc, ptr, ASCII_GT)) {
            *nextTokPtr = ptr;
            return XML_TOK_INVALID;
          }
          *nextTokPtr = ptr + MINBPC(enc);
          return XML_TOK_COMMENT;
        }
        break;
      default:
        ptr += MINBPC(enc);
        break;
      }
    }
  }
  return XML_TOK_PARTIAL;
}